

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall google::protobuf::DynamicMessage::~DynamicMessage(DynamicMessage *this)

{
  uint offset;
  Descriptor *this_00;
  DynamicMessage *pDVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CppType CVar5;
  FieldDescriptor *this_01;
  OneofDescriptor *pOVar6;
  char *pcVar7;
  int *piVar8;
  type puVar9;
  long *plVar10;
  int __c;
  int __c_00;
  DynamicMessage *in_RDI;
  Message *message;
  string *default_value_1;
  void *field_ptr;
  string *default_value;
  void *field_ptr_1;
  FieldDescriptor *field;
  int i;
  Descriptor *descriptor;
  long *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  CppType in_stack_fffffffffffffe84;
  string *in_stack_fffffffffffffe88;
  ExtensionSet *in_stack_fffffffffffffe90;
  uint local_14;
  
  (in_RDI->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DynamicMessage_009688d0;
  this_00 = in_RDI->type_info_->type;
  OffsetToPointer(in_RDI,in_RDI->type_info_->internal_metadata_offset);
  internal::InternalMetadataWithArena::~InternalMetadataWithArena
            ((InternalMetadataWithArena *)0x55cf3c);
  if (in_RDI->type_info_->extensions_offset != -1) {
    OffsetToPointer(in_RDI,in_RDI->type_info_->extensions_offset);
    internal::ExtensionSet::~ExtensionSet(in_stack_fffffffffffffe90);
  }
  for (local_14 = 0; iVar3 = Descriptor::field_count(this_00), (int)local_14 < iVar3;
      local_14 = local_14 + 1) {
    pcVar7 = (char *)(ulong)local_14;
    this_01 = Descriptor::field(this_00,local_14);
    pOVar6 = FieldDescriptor::containing_oneof(this_01);
    if (pOVar6 == (OneofDescriptor *)0x0) {
      puVar9 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                         ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                          CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                          (size_t)in_stack_fffffffffffffe78);
      plVar10 = (long *)OffsetToPointer(in_RDI,*puVar9);
      bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)0x55d31b);
      if (bVar2) {
        CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)0x55d33b);
        switch(CVar5) {
        case CPPTYPE_INT32:
          RepeatedField<int>::~RepeatedField
                    ((RepeatedField<int> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          break;
        case CPPTYPE_INT64:
          RepeatedField<long>::~RepeatedField
                    ((RepeatedField<long> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          break;
        case CPPTYPE_UINT32:
          RepeatedField<unsigned_int>::~RepeatedField
                    ((RepeatedField<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          break;
        case CPPTYPE_UINT64:
          RepeatedField<unsigned_long>::~RepeatedField
                    ((RepeatedField<unsigned_long> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          break;
        case CPPTYPE_DOUBLE:
          RepeatedField<double>::~RepeatedField
                    ((RepeatedField<double> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          break;
        case CPPTYPE_FLOAT:
          RepeatedField<float>::~RepeatedField
                    ((RepeatedField<float> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          break;
        case CPPTYPE_BOOL:
          RepeatedField<bool>::~RepeatedField
                    ((RepeatedField<bool> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          break;
        case CPPTYPE_ENUM:
          RepeatedField<int>::~RepeatedField
                    ((RepeatedField<int> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          break;
        case CPPTYPE_STRING:
          FieldDescriptor::options(this_01);
          FieldOptions::ctype((FieldOptions *)0x55d417);
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          break;
        case CPPTYPE_MESSAGE:
          bVar2 = anon_unknown_0::IsMapFieldInApi((FieldDescriptor *)0x55d445);
          if (bVar2) {
            (**(code **)*plVar10)();
          }
          else {
            RepeatedPtrField<google::protobuf::Message>::~RepeatedPtrField
                      ((RepeatedPtrField<google::protobuf::Message> *)
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          }
        }
      }
      else {
        CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)0x55d485);
        if (CVar5 == CPPTYPE_STRING) {
          FieldDescriptor::options(this_01);
          FieldOptions::ctype((FieldOptions *)0x55d4b6);
          pDVar1 = in_RDI->type_info_->prototype;
          puVar9 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                             ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              (size_t)in_stack_fffffffffffffe78);
          in_stack_fffffffffffffe90 = (ExtensionSet *)OffsetToPointer(pDVar1,*puVar9);
          in_stack_fffffffffffffe88 =
               internal::ArenaStringPtr::Get_abi_cxx11_((ArenaStringPtr *)in_stack_fffffffffffffe90)
          ;
          internal::ArenaStringPtr::Destroy
                    ((ArenaStringPtr *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                     (Arena *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        }
        else {
          in_stack_fffffffffffffe84 = FieldDescriptor::cpp_type((FieldDescriptor *)0x55d557);
          if (in_stack_fffffffffffffe84 == CPPTYPE_MESSAGE) {
            bVar2 = is_prototype(in_RDI);
            in_stack_fffffffffffffe80 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe80);
            if (((!bVar2) && (plVar10 = (long *)*plVar10, plVar10 != (long *)0x0)) &&
               (in_stack_fffffffffffffe78 = plVar10, plVar10 != (long *)0x0)) {
              (**(code **)(*plVar10 + 8))();
              in_stack_fffffffffffffe78 = plVar10;
            }
          }
        }
      }
    }
    else {
      iVar3 = in_RDI->type_info_->oneof_case_offset;
      pOVar6 = FieldDescriptor::containing_oneof(this_01);
      pcVar7 = OneofDescriptor::index(pOVar6,pcVar7,__c);
      offset = iVar3 + (int)pcVar7 * 4;
      pcVar7 = (char *)(ulong)offset;
      piVar8 = (int *)OffsetToPointer(in_RDI,offset);
      iVar3 = *piVar8;
      iVar4 = FieldDescriptor::number(this_01);
      if (iVar3 == iVar4) {
        Descriptor::field_count(this_00);
        pOVar6 = FieldDescriptor::containing_oneof(this_01);
        OneofDescriptor::index(pOVar6,pcVar7,__c_00);
        puVar9 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                           ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            (size_t)in_stack_fffffffffffffe78);
        plVar10 = (long *)OffsetToPointer(in_RDI,*puVar9);
        CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)0x55d199);
        if (CVar5 == CPPTYPE_STRING) {
          FieldDescriptor::options(this_01);
          FieldOptions::ctype((FieldOptions *)0x55d1d6);
          pDVar1 = in_RDI->type_info_->prototype;
          puVar9 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                             ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              (size_t)in_stack_fffffffffffffe78);
          internal::ArenaStringPtr::Get_abi_cxx11_
                    ((ArenaStringPtr *)
                     ((long)&(pDVar1->super_Message).super_MessageLite._vptr_MessageLite +
                     (ulong)*puVar9));
          internal::ArenaStringPtr::Destroy
                    ((ArenaStringPtr *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                     (Arena *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        }
        else {
          CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)0x55d281);
          if ((CVar5 == CPPTYPE_MESSAGE) && ((long *)*plVar10 != (long *)0x0)) {
            (**(code **)(*(long *)*plVar10 + 8))();
          }
        }
      }
    }
  }
  Message::~Message((Message *)0x55d5ec);
  return;
}

Assistant:

DynamicMessage::~DynamicMessage() {
  const Descriptor* descriptor = type_info_->type;

  reinterpret_cast<InternalMetadataWithArena*>(
      OffsetToPointer(type_info_->internal_metadata_offset))
      ->~InternalMetadataWithArena();

  if (type_info_->extensions_offset != -1) {
    reinterpret_cast<ExtensionSet*>(
        OffsetToPointer(type_info_->extensions_offset))
        ->~ExtensionSet();
  }

  // We need to manually run the destructors for repeated fields and strings,
  // just as we ran their constructors in the DynamicMessage constructor.
  // We also need to manually delete oneof fields if it is set and is string
  // or message.
  // Additionally, if any singular embedded messages have been allocated, we
  // need to delete them, UNLESS we are the prototype message of this type,
  // in which case any embedded messages are other prototypes and shouldn't
  // be touched.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    if (field->containing_oneof()) {
      void* field_ptr =
          OffsetToPointer(type_info_->oneof_case_offset +
                          sizeof(uint32) * field->containing_oneof()->index());
      if (*(reinterpret_cast<const uint32*>(field_ptr)) == field->number()) {
        field_ptr = OffsetToPointer(
            type_info_->offsets[descriptor->field_count() +
                                field->containing_oneof()->index()]);
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
          switch (field->options().ctype()) {
            default:
            case FieldOptions::STRING: {
              const std::string* default_value =
                  &(reinterpret_cast<const ArenaStringPtr*>(
                        reinterpret_cast<const uint8*>(type_info_->prototype) +
                        type_info_->offsets[i])
                        ->Get());
              reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy(
                  default_value, NULL);
              break;
            }
          }
        } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            delete *reinterpret_cast<Message**>(field_ptr);
        }
      }
      continue;
    }
    void* field_ptr = OffsetToPointer(type_info_->offsets[i]);

    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                  \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:               \
    reinterpret_cast<RepeatedField<LOWERCASE>*>(field_ptr) \
        ->~RepeatedField<LOWERCASE>();                     \
    break

        HANDLE_TYPE(INT32, int32);
        HANDLE_TYPE(INT64, int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
        HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              reinterpret_cast<RepeatedPtrField<std::string>*>(field_ptr)
                  ->~RepeatedPtrField<std::string>();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            reinterpret_cast<DynamicMapField*>(field_ptr)->~DynamicMapField();
          } else {
            reinterpret_cast<RepeatedPtrField<Message>*>(field_ptr)
                ->~RepeatedPtrField<Message>();
          }
          break;
      }

    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      switch (field->options().ctype()) {
        default:  // TODO(kenton):  Support other string reps.
        case FieldOptions::STRING: {
          const std::string* default_value =
              &(reinterpret_cast<const ArenaStringPtr*>(
                    type_info_->prototype->OffsetToPointer(
                        type_info_->offsets[i]))
                    ->Get());
          reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy(default_value,
                                                                NULL);
          break;
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          if (!is_prototype()) {
        Message* message = *reinterpret_cast<Message**>(field_ptr);
        if (message != NULL) {
          delete message;
        }
      }
    }
  }
}